

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O2

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
          (S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p,EdgeVisitor *visitor)

{
  uint uVar1;
  uint uVar2;
  int32 iVar3;
  bool bVar4;
  int iVar5;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference pvVar6;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar8;
  size_type_conflict n;
  ulong uVar9;
  Edge edge;
  VType local_98;
  VType VStack_90;
  VType local_88;
  VType VStack_80;
  VType local_78;
  VType VStack_70;
  ShapeEdge local_68;
  long *plVar7;
  
  bVar4 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(p,&this->it_);
  if (bVar4) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(&this->it_);
    uVar1 = *(uint *)this_00;
    for (n = 0; n != (uVar1 & 0xffffff); n = n + 1) {
      pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         (this_00,n);
      uVar2 = *(uint *)&pvVar6->field_0x4;
      if (1 < (ulong)uVar2) {
        iVar5 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)pvVar6->shape_id_);
        plVar7 = (long *)CONCAT44(extraout_var,iVar5);
        for (uVar9 = 0; ((ulong)uVar2 * 2 & 0xfffffffffffffffc) != uVar9; uVar9 = uVar9 + 4) {
          paVar8 = &pvVar6->field_3;
          if (5 < *(uint *)&pvVar6->field_0x4) {
            paVar8 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar6->field_3).edges_;
          }
          iVar3 = *(int32 *)((long)paVar8 + uVar9);
          (**(code **)(*plVar7 + 0x18))((BasicVector<Vector3,_double,_3UL> *)&local_98,plVar7,iVar3)
          ;
          bVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)&local_98,p);
          if ((bVar4) ||
             (bVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                ((BasicVector<Vector3,_double,_3UL> *)&VStack_80,p), bVar4)) {
            local_68.id_.shape_id = (int32)plVar7[1];
            local_68.edge_.v1.c_[1] = local_78;
            local_68.edge_.v1.c_[2] = VStack_70;
            local_68.edge_.v0.c_[2] = local_88;
            local_68.edge_.v1.c_[0] = VStack_80;
            local_68.edge_.v0.c_[0] = local_98;
            local_68.edge_.v0.c_[1] = VStack_90;
            local_68.id_.edge_id = iVar3;
            bVar4 = std::function<bool_(const_s2shapeutil::ShapeEdge_&)>::operator()
                              (visitor,&local_68);
            if (!bVar4) {
              return false;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitIncidentEdges(
    const S2Point& p, const EdgeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int num_edges = clipped.num_edges();
    if (num_edges == 0) continue;
    const S2Shape& shape = *index_->shape(clipped.shape_id());
    for (int i = 0; i < num_edges; ++i) {
      int edge_id = clipped.edge(i);
      auto edge = shape.edge(edge_id);
      if ((edge.v0 == p || edge.v1 == p) &&
          !visitor(s2shapeutil::ShapeEdge(shape.id(), edge_id, edge))) {
        return false;
      }
    }
  }
  return true;
}